

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairedReadsMapper.cc
# Opt level: O0

sgNodeID_t __thiscall
PairedReadsMapper::get_node_inmediate_neighbours(PairedReadsMapper *this,sgNodeID_t node)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference ppVar3;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *in_RDI;
  pair<long,_int> *cand;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *__range1_2;
  pair<const_long,_int> *x;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  *__range1_1;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> count_vector;
  long *node_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> *path;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  counter;
  sgNodeID_t next_node;
  value_type *in_stack_fffffffffffffe98;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  *in_stack_fffffffffffffea0;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  *__lhs;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  local_130;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  *local_128;
  pair<long,_int> *local_118;
  pair<long,_int> *local_110;
  pair<long,_int> local_108;
  reference local_f8;
  _Node_iterator_base<std::pair<const_long,_int>,_false> local_f0;
  _Node_iterator_base<std::pair<const_long,_int>,_false> local_e8;
  undefined1 *local_e0;
  __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
  local_d8 [3];
  reference local_c0;
  long *local_b8;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_b0;
  reference local_a8;
  reference local_a0;
  vector<long,_std::allocator<long>_> *local_98;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_90;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  sgNodeID_t in_stack_ffffffffffffff80;
  PairedReadsMapper *in_stack_ffffffffffffff88;
  undefined1 local_58 [56];
  long local_20;
  long local_8;
  
  local_20 = 0;
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::unordered_map((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                   *)0x43576d);
  all_paths_fw(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f,
               (bool)in_stack_ffffffffffffff7e);
  local_90._M_current =
       (vector<long,_std::allocator<long>_> *)
       std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)in_stack_fffffffffffffe98);
  local_98 = (vector<long,_std::allocator<long>_> *)
             std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
               ::operator*(&local_90);
    local_a0 = local_a8;
    local_b0._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe98);
    local_b8 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*(&local_b0);
      pmVar2 = std::
               unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
               ::operator[](in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first);
      *pmVar2 = *pmVar2 + 1;
      __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
      operator++(&local_b0);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
    ::operator++(&local_90);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)in_RDI);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::vector
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0x43590d);
  local_e0 = local_58;
  local_e8._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
       ::begin((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                *)in_stack_fffffffffffffe98);
  local_f0._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
       ::end((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
              *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_e8,&local_f0);
    if (!bVar1) break;
    local_f8 = std::__detail::_Node_iterator<std::pair<const_long,_int>,_false,_false>::operator*
                         ((_Node_iterator<std::pair<const_long,_int>,_false,_false> *)0x435969);
    std::pair<long,_int>::pair<const_long,_int,_true>(&local_108,local_f8);
    std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::push_back
              ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__detail::_Node_iterator<std::pair<const_long,_int>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_long,_int>,_false,_false> *)in_stack_fffffffffffffea0
              );
  }
  __lhs = local_d8;
  local_110 = (pair<long,_int> *)
              std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::begin
                        ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
                         in_stack_fffffffffffffe98);
  local_118 = (pair<long,_int> *)
              std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::end
                        ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
                         in_stack_fffffffffffffe98);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>
            (local_110,local_118);
  local_128 = local_d8;
  local_130._M_current =
       (pair<long,_int> *)
       std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::begin
                 ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
                  in_stack_fffffffffffffe98);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::end
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)
             in_stack_fffffffffffffe98);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                              *)in_stack_fffffffffffffe98);
    if (!bVar1) {
      local_8 = local_20;
LAB_00435aa6:
      std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~vector(in_RDI);
      std::
      unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
      ::~unordered_map((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                        *)0x435ac0);
      return local_8;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
             ::operator*(&local_130);
    if ((ppVar3->first != 0) && (10 < ppVar3->second)) {
      local_8 = ppVar3->first;
      goto LAB_00435aa6;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
    ::operator++(&local_130);
  } while( true );
}

Assistant:

sgNodeID_t PairedReadsMapper::get_node_inmediate_neighbours(sgNodeID_t node){
    // 0 returning node is equivalent to None (in python)
    sgNodeID_t next_node=0;
    std::unordered_map<sgNodeID_t, int> counter;
    for(const auto &path: all_paths_fw(node)){
        for (const auto &node: path){
            counter[node]++;
        }
    }

    std::vector<std::pair<sgNodeID_t, int>> count_vector;
    for (const auto &x: counter){
        count_vector.push_back(x);
    }
    std::sort(count_vector.begin(), count_vector.end(), [](std::pair<sgNodeID_t, int>& a, std::pair<sgNodeID_t, int>& b){return a.second>b.second;});

    for (const auto& cand: count_vector){
        if (cand.first != 0 and cand.second>10){
            return cand.first;
        }
    }
    return next_node;
}